

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         FullClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,Options *options)

{
  ulong uVar1;
  AlphaNum *in_R8;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  undefined1 local_60 [8];
  string php_namespace;
  string classname;
  Options *options_local;
  EnumDescriptor *desc_local;
  
  GeneratedClassName_abi_cxx11_
            ((string *)((long)&php_namespace.field_2 + 8),(php *)desc,(EnumDescriptor *)options);
  RootPhpNamespace<google::protobuf::EnumDescriptor>((string *)local_60,desc,options);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,"\\");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&php_namespace.field_2 + 8));
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_a0,&local_d0,&local_100,in_R8);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(php_namespace.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(php_namespace.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, const Options& options) {
  std::string classname = GeneratedClassName(desc);
  std::string php_namespace = RootPhpNamespace(desc, options);
  if (!php_namespace.empty()) {
    return absl::StrCat(php_namespace, "\\", classname);
  }
  return classname;
}